

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::UpdateNextBranchIslandOffset
          (ByteCodeWriter *this,uint firstUnknownJumpInfo,uint firstUnknownJumpOffset)

{
  int iVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  uint firstUnknownJumpOffset_local;
  uint firstUnknownJumpInfo_local;
  ByteCodeWriter *this_local;
  
  this->firstUnknownJumpInfo = firstUnknownJumpInfo;
  iVar2 = GetBranchLimit();
  iVar1 = LongBranchSize;
  iVar4 = (firstUnknownJumpOffset + iVar2) - JumpAroundSize;
  iVar3 = JsUtil::
          ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this->m_jumpOffsets->
                      super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                    );
  this->nextBranchIslandOffset = (iVar4 + -0x4e) - iVar1 * (iVar3 - firstUnknownJumpInfo);
  return;
}

Assistant:

void ByteCodeWriter::UpdateNextBranchIslandOffset(uint firstUnknownJumpInfo, uint firstUnknownJumpOffset)
    {
        this->firstUnknownJumpInfo = firstUnknownJumpInfo;

        // We will need to emit the next branch from the first branch + branch limit.
        // But leave room for the jump around and one extra byte code instruction.
        // Also account for all the long branches we may have to emit as well.
        this->nextBranchIslandOffset = firstUnknownJumpOffset + GetBranchLimit()
            - JumpAroundSize - MaxLayoutSize - MaxOpCodeSize - LongBranchSize * (m_jumpOffsets->Count() - firstUnknownJumpInfo);
    }